

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::TiledInputFile::initialize(TiledInputFile *this)

{
  int maxX;
  int minY;
  int maxY;
  uint uVar1;
  LevelMode LVar2;
  LevelRoundingMode LVar3;
  bool bVar4;
  Format FVar5;
  int iVar6;
  string *__lhs;
  TileDescription *pTVar7;
  LineOrder *pLVar8;
  Box2i *pBVar9;
  size_t sVar10;
  TileBuffer *pTVar11;
  Compression *pCVar12;
  Compressor *compressor;
  char *pcVar13;
  ArgExc *this_00;
  Data *pDVar14;
  ulong uVar15;
  TileOffsets TStack_58;
  
  pDVar14 = this->_data;
  if ((pDVar14->version & 0x1a00U) == 0x200) {
    bVar4 = Header::hasType(&pDVar14->header);
    pDVar14 = this->_data;
    if (bVar4) {
      Header::setType(&pDVar14->header,(string *)TILEDIMAGE_abi_cxx11_);
      pDVar14 = this->_data;
    }
  }
  if (pDVar14->partNumber == -1) {
    if ((pDVar14->version & 0x200) == 0) {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      pcVar13 = "Expected a tiled file but the file is not tiled.";
LAB_003fb0b6:
      Iex_2_5::ArgExc::ArgExc(this_00,pcVar13);
      __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  else {
    bVar4 = Header::hasType(&pDVar14->header);
    pDVar14 = this->_data;
    if (bVar4) {
      __lhs = Header::type_abi_cxx11_(&pDVar14->header);
      bVar4 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)TILEDIMAGE_abi_cxx11_);
      if (bVar4) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar13 = "TiledInputFile used for non-tiledimage part.";
        goto LAB_003fb0b6;
      }
      pDVar14 = this->_data;
    }
  }
  Header::sanityCheck(&pDVar14->header,true,false);
  pTVar7 = Header::tileDescription(&this->_data->header);
  pDVar14 = this->_data;
  uVar1 = pTVar7->ySize;
  LVar2 = pTVar7->mode;
  LVar3 = pTVar7->roundingMode;
  (pDVar14->tileDesc).xSize = pTVar7->xSize;
  (pDVar14->tileDesc).ySize = uVar1;
  (pDVar14->tileDesc).mode = LVar2;
  (pDVar14->tileDesc).roundingMode = LVar3;
  pLVar8 = Header::lineOrder(&this->_data->header);
  pDVar14 = this->_data;
  pDVar14->lineOrder = *pLVar8;
  pBVar9 = Header::dataWindow(&pDVar14->header);
  iVar6 = (pBVar9->min).x;
  pDVar14 = this->_data;
  pDVar14->minX = iVar6;
  maxX = (pBVar9->max).x;
  pDVar14->maxX = maxX;
  minY = (pBVar9->min).y;
  pDVar14->minY = minY;
  maxY = (pBVar9->max).y;
  pDVar14->maxY = maxY;
  precalculateTileInfo
            (&pDVar14->tileDesc,iVar6,maxX,minY,maxY,&pDVar14->numXTiles,&pDVar14->numYTiles,
             &pDVar14->numXLevels,&pDVar14->numYLevels);
  sVar10 = calculateBytesPerPixel(&this->_data->header);
  pDVar14 = this->_data;
  pDVar14->bytesPerPixel = sVar10;
  uVar1 = (pDVar14->tileDesc).ySize;
  sVar10 = (pDVar14->tileDesc).xSize * sVar10;
  pDVar14->maxBytesPerTileLine = sVar10;
  pDVar14->tileBufferSize = uVar1 * sVar10;
  for (uVar15 = 0;
      uVar15 < (ulong)((long)(pDVar14->tileBuffers).
                             super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pDVar14->tileBuffers).
                             super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar15 = uVar15 + 1) {
    pTVar11 = (TileBuffer *)operator_new(0x80);
    pCVar12 = Header::compression(&pDVar14->header);
    pDVar14 = this->_data;
    compressor = newTileCompressor(*pCVar12,pDVar14->maxBytesPerTileLine,
                                   (ulong)(pDVar14->tileDesc).ySize,&pDVar14->header);
    pTVar11->uncompressedData = (char *)0x0;
    pTVar11->buffer = (char *)0x0;
    pTVar11->dataSize = 0;
    pTVar11->compressor = compressor;
    FVar5 = defaultFormat(compressor);
    pTVar11->format = FVar5;
    pTVar11->dx = -1;
    pTVar11->dy = -1;
    pTVar11->lx = -1;
    pTVar11->ly = -1;
    pTVar11->hasException = false;
    (pTVar11->exception)._M_dataplus._M_p = (pointer)&(pTVar11->exception).field_2;
    (pTVar11->exception)._M_string_length = 0;
    (pTVar11->exception).field_2._M_local_buf[0] = '\0';
    IlmThread_2_5::Semaphore::Semaphore(&pTVar11->_sem,1);
    (this->_data->tileBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15] = pTVar11;
    iVar6 = (*this->_data->_streamData->is->_vptr_IStream[2])();
    pDVar14 = this->_data;
    if ((char)iVar6 == '\0') {
      pcVar13 = (char *)operator_new__(pDVar14->tileBufferSize);
      (pDVar14->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar15]->buffer = pcVar13;
    }
  }
  TileOffsets::TileOffsets
            (&TStack_58,(pDVar14->tileDesc).mode,pDVar14->numXLevels,pDVar14->numYLevels,
             pDVar14->numXTiles,pDVar14->numYTiles);
  TileOffsets::operator=(&this->_data->tileOffsets,&TStack_58);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&TStack_58._offsets);
  return;
}

Assistant:

void
TiledInputFile::initialize ()
{
    // fix bad types in header (arises when a tool built against an older version of
    // OpenEXR converts a scanline image to tiled)
    // only applies when file is a single part, regular image, tiled file
    //
    if(!isMultiPart(_data->version) &&
       !isNonImage(_data->version) && 
       isTiled(_data->version) && 
       _data->header.hasType() )
    {
        _data->header.setType(TILEDIMAGE);
    }
    
    if (_data->partNumber == -1)
    {
        if (!isTiled (_data->version))
            throw IEX_NAMESPACE::ArgExc ("Expected a tiled file but the file is not tiled.");
        
    }
    else
    {
        if(_data->header.hasType() && _data->header.type()!=TILEDIMAGE)
        {
            throw IEX_NAMESPACE::ArgExc ("TiledInputFile used for non-tiledimage part.");
        }
    }
    
    _data->header.sanityCheck (true);

    _data->tileDesc = _data->header.tileDescription();
    _data->lineOrder = _data->header.lineOrder();

    //
    // Save the dataWindow information
    //
    
    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
			  _data->minX, _data->maxX,
			  _data->minY, _data->maxY,
			  _data->numXTiles, _data->numYTiles,
			  _data->numXLevels, _data->numYLevels);    

    _data->bytesPerPixel = calculateBytesPerPixel (_data->header);

    _data->maxBytesPerTileLine = _data->bytesPerPixel * _data->tileDesc.xSize;

    _data->tileBufferSize = _data->maxBytesPerTileLine * _data->tileDesc.ySize;

    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
    {
        _data->tileBuffers[i] = new TileBuffer (newTileCompressor
						  (_data->header.compression(),
						   _data->maxBytesPerTileLine,
						   _data->tileDesc.ySize,
						   _data->header));

        if (!_data->_streamData->is->isMemoryMapped ())
            _data->tileBuffers[i]->buffer = new char [_data->tileBufferSize];
    }

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
				      _data->numXLevels,
				      _data->numYLevels,
				      _data->numXTiles,
				      _data->numYTiles);
}